

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O1

void __thiscall
chrono::ChArchiveIn::in<chrono::ChBezierCurve>
          (ChArchiveIn *this,ChNameValue<std::shared_ptr<chrono::ChBezierCurve>_> *bVal)

{
  shared_ptr<chrono::ChBezierCurve> *psVar1;
  long *plVar2;
  ChBezierCurve *pCVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  long lVar5;
  mapped_type *pmVar6;
  ChBezierCurve *__tmp;
  ulong uVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long *plVar8;
  long *plVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  element_type *peVar11;
  ChBezierCurve *mptr;
  ChFunctorArchiveInSpecificPtr<chrono::ChBezierCurve> specFuncA;
  ChBezierCurve *local_60;
  ChBezierCurve *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_50 [2];
  undefined **local_40;
  ChBezierCurve **local_38;
  char *local_30;
  undefined ***local_28;
  char local_20;
  
  local_28 = &local_40;
  local_40 = &PTR__ChFunctorArchiveIn_00b65e50;
  local_38 = &local_60;
  local_30 = bVal->_name;
  local_20 = bVal->_flags;
  lVar5 = (**(code **)(*(long *)this + 0x68))();
  if (lVar5 == 0) {
    uVar7 = (ulong)local_60 % *(ulong *)(this + 0xd0);
    plVar8 = *(long **)(*(long *)(this + 200) + uVar7 * 8);
    plVar9 = (long *)0x0;
    if ((plVar8 != (long *)0x0) &&
       (plVar2 = (long *)*plVar8, plVar9 = plVar8, local_60 != (ChBezierCurve *)((long *)*plVar8)[1]
       )) {
      while (plVar8 = plVar2, plVar2 = (long *)*plVar8, plVar2 != (long *)0x0) {
        plVar9 = (long *)0x0;
        if (((ulong)plVar2[1] % *(ulong *)(this + 0xd0) != uVar7) ||
           (plVar9 = plVar8, local_60 == (ChBezierCurve *)plVar2[1])) goto LAB_0081cb9f;
      }
      plVar9 = (long *)0x0;
    }
LAB_0081cb9f:
    if ((plVar9 != (long *)0x0) && (*plVar9 != 0)) {
      local_58 = local_60;
      pmVar6 = std::__detail::
               _Map_base<void_*,_std::pair<void_*const,_std::shared_ptr<void>_>,_std::allocator<std::pair<void_*const,_std::shared_ptr<void>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<void_*,_std::pair<void_*const,_std::shared_ptr<void>_>,_std::allocator<std::pair<void_*const,_std::shared_ptr<void>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)(this + 200),&local_58);
      peVar11 = (element_type *)
                (pmVar6->super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      p_Var10 = (pmVar6->super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
        }
      }
      psVar1 = bVal->_value;
      (psVar1->super___shared_ptr<chrono::ChBezierCurve,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           peVar11;
      this_00 = (psVar1->super___shared_ptr<chrono::ChBezierCurve,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      (psVar1->super___shared_ptr<chrono::ChBezierCurve,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
      _M_pi = p_Var10;
      goto LAB_0081cc79;
    }
    local_58 = local_60;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChBezierCurve*>
              (a_Stack_50,local_60);
    _Var4._M_pi = a_Stack_50[0]._M_pi;
    pCVar3 = local_58;
    psVar1 = bVal->_value;
    local_58 = (ChBezierCurve *)0x0;
    a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var10 = (psVar1->super___shared_ptr<chrono::ChBezierCurve,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
    (psVar1->super___shared_ptr<chrono::ChBezierCurve,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = pCVar3;
    (psVar1->super___shared_ptr<chrono::ChBezierCurve,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
    _M_pi = _Var4._M_pi;
    if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
    }
    if (a_Stack_50[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_50[0]._M_pi);
    }
    peVar11 = (bVal->_value->super___shared_ptr<chrono::ChBezierCurve,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    p_Var10 = (bVal->_value->super___shared_ptr<chrono::ChBezierCurve,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
    if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
      }
    }
    local_58 = local_60;
    pmVar6 = std::__detail::
             _Map_base<void_*,_std::pair<void_*const,_std::shared_ptr<void>_>,_std::allocator<std::pair<void_*const,_std::shared_ptr<void>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<void_*,_std::pair<void_*const,_std::shared_ptr<void>_>,_std::allocator<std::pair<void_*const,_std::shared_ptr<void>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)(this + 200),&local_58);
  }
  else {
    local_58 = local_60;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChBezierCurve*>
              (a_Stack_50,local_60);
    _Var4._M_pi = a_Stack_50[0]._M_pi;
    pCVar3 = local_58;
    psVar1 = bVal->_value;
    local_58 = (ChBezierCurve *)0x0;
    a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var10 = (psVar1->super___shared_ptr<chrono::ChBezierCurve,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
    (psVar1->super___shared_ptr<chrono::ChBezierCurve,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = pCVar3;
    (psVar1->super___shared_ptr<chrono::ChBezierCurve,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
    _M_pi = _Var4._M_pi;
    if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
    }
    if (a_Stack_50[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_50[0]._M_pi);
    }
    peVar11 = (bVal->_value->super___shared_ptr<chrono::ChBezierCurve,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    p_Var10 = (bVal->_value->super___shared_ptr<chrono::ChBezierCurve,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
    if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
      }
    }
    local_58 = local_60;
    pmVar6 = std::__detail::
             _Map_base<void_*,_std::pair<void_*const,_std::shared_ptr<void>_>,_std::allocator<std::pair<void_*const,_std::shared_ptr<void>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<void_*,_std::pair<void_*const,_std::shared_ptr<void>_>,_std::allocator<std::pair<void_*const,_std::shared_ptr<void>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)(this + 200),&local_58);
  }
  (pmVar6->super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar11;
  this_00 = (pmVar6->super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (pmVar6->super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi = p_Var10;
LAB_0081cc79:
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void in     (ChNameValue< std::shared_ptr<T> > bVal) {
          T* mptr;
          ChFunctorArchiveInSpecificPtr<T> specFuncA(&mptr);
          ChNameValue<ChFunctorArchiveIn> mtmp(bVal.name(), specFuncA, bVal.flags());
          void* newptr = this->in_ref(mtmp);

          // Some additional complication respect to raw pointers: 
          // it must properly increment shared count of shared pointers.
          if(newptr) {
              // case A: new object, so just make a shared ptr with initial count=1
              bVal.value() = std::shared_ptr<T> ( mptr ); 
              this->shared_ptr_map[mptr] = std::static_pointer_cast<void>(bVal.value());
          }
          else {
              if (this->shared_ptr_map.find(mptr) != this->shared_ptr_map.end()) {
                  // case B1: preexisting object, previously referenced by a shared ptr, so increment ref count
                  bVal.value() = std::static_pointer_cast<T>(shared_ptr_map[mptr]);
              }
              else {
                  // case B2: preexisting object, but not referenced by shared ptr (maybe by some raw ptr) so just make a shared ptr with initial count=1
                  bVal.value() = std::shared_ptr<T> ( mptr ); 
                  this->shared_ptr_map[mptr] = std::static_pointer_cast<void>(bVal.value());
              }
          }
      }